

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendFlags
          (cmLocalUnixMakefileGenerator3 *this,string *flags,string *newFlags)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  undefined1 local_40 [8];
  string newf;
  string *newFlags_local;
  string *flags_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  newf.field_2._8_8_ = newFlags;
  bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::string((string *)local_40,(string *)newf.field_2._8_8_);
    lVar3 = std::__cxx11::string::find(local_40,0x7e3786);
    if (lVar3 != -1) {
      cmsys::SystemTools::ReplaceString((string *)local_40,"\\\"","\"");
      cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,(string *)local_40);
    }
    std::__cxx11::string::~string((string *)local_40);
    if (lVar3 != -1) {
      return;
    }
  }
  cmLocalGenerator::AppendFlags((cmLocalGenerator *)this,flags,(string *)newf.field_2._8_8_);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendFlags(
  std::string& flags, const std::string& newFlags) const
{
  if (this->IsWatcomWMake() && !newFlags.empty()) {
    std::string newf = newFlags;
    if (newf.find("\\\"") != std::string::npos) {
      cmSystemTools::ReplaceString(newf, "\\\"", "\"");
      this->cmLocalGenerator::AppendFlags(flags, newf);
      return;
    }
  }
  this->cmLocalGenerator::AppendFlags(flags, newFlags);
}